

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_parser.c
# Opt level: O2

char * flatcc_json_parser_error_string(int err)

{
  if ((uint)err < 0x25) {
    return &DAT_00128420 + *(int *)(&DAT_00128420 + (ulong)(uint)err * 4);
  }
  return "unknown";
}

Assistant:

const char *flatcc_json_parser_error_string(int err)
{
    switch (err) {
#define XX(no, str)                                                         \
    case flatcc_json_parser_error_##no:                                     \
        return str;
        FLATCC_JSON_PARSE_ERROR_MAP(XX)
#undef XX
    default:
        return "unknown";
    }
}